

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O2

string * __thiscall
libcellml::ComponentEntity::encapsulationId_abi_cxx11_
          (string *__return_storage_ptr__,ComponentEntity *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             &(this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[3].mId.
              _M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string ComponentEntity::encapsulationId() const
{
    return pFunc()->mEncapsulationId;
}